

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIF.cpp
# Opt level: O0

void __thiscall LIF::LIF(LIF *this)

{
  Neuron *pNVar1;
  LIF_param *this_00;
  Neuron *in_RDI;
  
  Neuron::Neuron(in_RDI);
  in_RDI->_vptr_Neuron = (_func_int **)&PTR_update_0018e910;
  in_RDI[1].logger = (Logging *)0x0;
  pNVar1 = in_RDI + 2;
  this_00 = (LIF_param *)operator_new(0x28);
  LIF_param::LIF_param(this_00);
  pNVar1->populationID = (long)this_00;
  in_RDI[1].populationID = *(long *)in_RDI[2].populationID;
  in_RDI[1]._vptr_Neuron = (_func_int **)0x0;
  *(undefined8 *)&in_RDI[1].neuronID = 0;
  Neuron::initialize(in_RDI);
  return;
}

Assistant:

LIF::LIF() : param(new LIF_param) {
    u = param->u_rest;
    t_rest = 0.0;
    i = 0.0;
    initialize();
}